

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

uint Imf_3_2::anon_unknown_6::roundListSizeUp(uint n)

{
  uint s;
  uint n_local;
  undefined4 local_4;
  
  if (n == 0) {
    local_4 = 0;
  }
  else {
    for (s = 1; s < n; s = s << 1) {
    }
    local_4 = s;
  }
  return local_4;
}

Assistant:

unsigned int
roundListSizeUp (unsigned int n)
{
    //
    // Calculate the number of samples to be allocated for a sample list
    // with n entries by rounding n up to the next power of two.
    //

    if (n == 0) return 0;

    unsigned int s = 1;

    while (s < n)
        s <<= 1;

    return s;
}